

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

xmlChar * xmlParseNmtoken(xmlParserCtxtPtr ctxt)

{
  xmlParserInputPtr pxVar1;
  int iVar2;
  int iVar3;
  xmlChar *pxVar4;
  xmlChar *pxVar5;
  int iVar6;
  uint len;
  uint uVar7;
  int l;
  int local_b4;
  ulong local_b0;
  xmlChar buf [105];
  
  local_b4 = 10000000;
  if ((ctxt->options & 0x80000) == 0) {
    local_b4 = 50000;
  }
  if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
    xmlGROW(ctxt);
  }
  if (ctxt->instate != XML_PARSER_EOF) {
    iVar2 = xmlCurrentChar(ctxt,&l);
    iVar6 = 0;
    len = 0;
    do {
      iVar3 = xmlIsNameChar(ctxt,iVar2);
      if (iVar3 == 0) {
        if (len == 0) {
          return (xmlChar *)0x0;
        }
        pxVar4 = xmlStrndup(buf,len);
        return pxVar4;
      }
      if (iVar6 < 0x65) {
        iVar6 = iVar6 + 1;
      }
      else {
        iVar6 = 0;
        if ((ctxt->progressive == 0) &&
           (iVar6 = 0, (long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
          xmlGROW(ctxt);
        }
      }
      if (l == 1) {
        uVar7 = len + 1;
        buf[(int)len] = (xmlChar)iVar2;
      }
      else {
        iVar2 = xmlCopyCharMultiByte(buf + (int)len,iVar2);
        uVar7 = len + iVar2;
      }
      pxVar1 = ctxt->input;
      if (*pxVar1->cur == '\n') {
        pxVar1->line = pxVar1->line + 1;
        pxVar1->col = 1;
      }
      else {
        pxVar1->col = pxVar1->col + 1;
      }
      pxVar1->cur = pxVar1->cur + l;
      iVar2 = xmlCurrentChar(ctxt,&l);
      if (iVar2 == 0) {
        if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
          xmlGROW(ctxt);
        }
        if (ctxt->instate == XML_PARSER_EOF) {
          return (xmlChar *)0x0;
        }
        iVar2 = xmlCurrentChar(ctxt,&l);
        iVar6 = 0;
      }
      len = uVar7;
    } while ((int)uVar7 < 100);
    local_b0 = (ulong)(uVar7 * 2);
    pxVar4 = (xmlChar *)(*xmlMallocAtomic)(local_b0);
    if (pxVar4 == (xmlChar *)0x0) {
      xmlErrMemory(ctxt,(char *)0x0);
    }
    else {
      memcpy(pxVar4,buf,(ulong)uVar7);
      do {
        iVar3 = xmlIsNameChar(ctxt,iVar2);
        if (iVar3 == 0) {
          pxVar4[(int)uVar7] = '\0';
          return pxVar4;
        }
        if (iVar6 < 0x65) {
          iVar6 = iVar6 + 1;
        }
        else {
          if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa))
          {
            xmlGROW(ctxt);
          }
          iVar6 = 0;
          if (ctxt->instate == XML_PARSER_EOF) goto LAB_00156085;
        }
        pxVar5 = pxVar4;
        if ((int)local_b0 < (int)(uVar7 + 10)) {
          local_b0 = (ulong)(uint)((int)local_b0 * 2);
          pxVar5 = (xmlChar *)(*xmlRealloc)(pxVar4,local_b0);
          if (pxVar5 == (xmlChar *)0x0) {
            xmlErrMemory(ctxt,(char *)0x0);
            goto LAB_00156085;
          }
        }
        if (l == 1) {
          pxVar5[(int)uVar7] = (xmlChar)iVar2;
          uVar7 = uVar7 + 1;
        }
        else {
          iVar2 = xmlCopyCharMultiByte(pxVar5 + (int)uVar7,iVar2);
          uVar7 = iVar2 + uVar7;
        }
        pxVar1 = ctxt->input;
        if (*pxVar1->cur == '\n') {
          pxVar1->line = pxVar1->line + 1;
          pxVar1->col = 1;
        }
        else {
          pxVar1->col = pxVar1->col + 1;
        }
        pxVar1->cur = pxVar1->cur + l;
        iVar2 = xmlCurrentChar(ctxt,&l);
        pxVar4 = pxVar5;
      } while ((int)uVar7 <= local_b4);
      xmlFatalErr(ctxt,XML_ERR_NAME_TOO_LONG,"NmToken");
LAB_00156085:
      (*xmlFree)(pxVar4);
    }
  }
  return (xmlChar *)0x0;
}

Assistant:

xmlChar *
xmlParseNmtoken(xmlParserCtxtPtr ctxt) {
    xmlChar buf[XML_MAX_NAMELEN + 5];
    int len = 0, l;
    int c;
    int count = 0;
    int maxLength = (ctxt->options & XML_PARSE_HUGE) ?
                    XML_MAX_TEXT_LENGTH :
                    XML_MAX_NAME_LENGTH;

#ifdef DEBUG
    nbParseNmToken++;
#endif

    GROW;
    if (ctxt->instate == XML_PARSER_EOF)
        return(NULL);
    c = CUR_CHAR(l);

    while (xmlIsNameChar(ctxt, c)) {
	if (count++ > XML_PARSER_CHUNK_SIZE) {
	    count = 0;
	    GROW;
	}
	COPY_BUF(l,buf,len,c);
	NEXTL(l);
	c = CUR_CHAR(l);
	if (c == 0) {
	    count = 0;
	    GROW;
	    if (ctxt->instate == XML_PARSER_EOF)
		return(NULL);
            c = CUR_CHAR(l);
	}
	if (len >= XML_MAX_NAMELEN) {
	    /*
	     * Okay someone managed to make a huge token, so he's ready to pay
	     * for the processing speed.
	     */
	    xmlChar *buffer;
	    int max = len * 2;

	    buffer = (xmlChar *) xmlMallocAtomic(max);
	    if (buffer == NULL) {
	        xmlErrMemory(ctxt, NULL);
		return(NULL);
	    }
	    memcpy(buffer, buf, len);
	    while (xmlIsNameChar(ctxt, c)) {
		if (count++ > XML_PARSER_CHUNK_SIZE) {
		    count = 0;
		    GROW;
                    if (ctxt->instate == XML_PARSER_EOF) {
                        xmlFree(buffer);
                        return(NULL);
                    }
		}
		if (len + 10 > max) {
		    xmlChar *tmp;

		    max *= 2;
		    tmp = (xmlChar *) xmlRealloc(buffer, max);
		    if (tmp == NULL) {
			xmlErrMemory(ctxt, NULL);
			xmlFree(buffer);
			return(NULL);
		    }
		    buffer = tmp;
		}
		COPY_BUF(l,buffer,len,c);
		NEXTL(l);
		c = CUR_CHAR(l);
                if (len > maxLength) {
                    xmlFatalErr(ctxt, XML_ERR_NAME_TOO_LONG, "NmToken");
                    xmlFree(buffer);
                    return(NULL);
                }
	    }
	    buffer[len] = 0;
	    return(buffer);
	}
    }
    if (len == 0)
        return(NULL);
    if (len > maxLength) {
        xmlFatalErr(ctxt, XML_ERR_NAME_TOO_LONG, "NmToken");
        return(NULL);
    }
    return(xmlStrndup(buf, len));
}